

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::VaryingComponentsTest::getProgramInterface
          (VaryingComponentsTest *this,GLuint test_case_index,ProgramInterface *program_interface,
          VaryingPassthrough *varying_passthrough)

{
  testCase *test_case;
  pointer ptVar1;
  ProgramInterface *program_interface_00;
  VaryingPassthrough *varying_passthrough_00;
  int iVar2;
  pointer __dest;
  size_t __n;
  ulong uVar3;
  bool bVar4;
  Type local_f0;
  ProgramInterface *local_e0;
  VaryingPassthrough *local_d8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  ShaderInterface si;
  
  local_d8 = varying_passthrough;
  iVar2 = (**(code **)((long)(this->super_VaryingLocationsTest).super_TextureTestBase.super_TestBase
                             .super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 0x110))
                    ();
  ptVar1 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f0._0_8_ = (ulong)ptVar1[test_case_index].m_type | 0x100000000;
  local_f0.m_n_rows = 4;
  local_e0 = program_interface;
  Utils::ShaderInterface::ShaderInterface(&si,&program_interface->m_vertex);
  Utils::Type::GenerateDataPacked
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d0,&local_f0);
  uVar3 = (ulong)(iVar2 + (uint)(iVar2 == 0));
  __n = (long)local_d0._M_impl.super__Vector_impl_data._M_finish -
        (long)local_d0._M_impl.super__Vector_impl_data._M_start;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->m_data,__n * uVar3);
  test_case = ptVar1 + test_case_index;
  __dest = (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  while (varying_passthrough_00 = local_d8, program_interface_00 = local_e0, bVar4 = uVar3 != 0,
        uVar3 = uVar3 - 1, bVar4) {
    memcpy(__dest,local_d0._M_impl.super__Vector_impl_data._M_start,__n);
    __dest = __dest + __n;
  }
  prepareShaderStage(this,FRAGMENT,&local_f0,local_e0,test_case,local_d8);
  prepareShaderStage(this,GEOMETRY,&local_f0,program_interface_00,test_case,varying_passthrough_00);
  prepareShaderStage(this,TESS_CTRL,&local_f0,program_interface_00,test_case,varying_passthrough_00)
  ;
  prepareShaderStage(this,TESS_EVAL,&local_f0,program_interface_00,test_case,varying_passthrough_00)
  ;
  prepareShaderStage(this,VERTEX,&local_f0,program_interface_00,test_case,varying_passthrough_00);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d0);
  Utils::ShaderInterface::~ShaderInterface(&si);
  return;
}

Assistant:

void VaryingComponentsTest::getProgramInterface(GLuint test_case_index, Utils::ProgramInterface& program_interface,
												Utils::VaryingPassthrough& varying_passthrough)
{
	GLuint				   array_length = getArrayLength();
	const testCase&		   test_case	= m_test_cases[test_case_index];
	const Utils::Type	  vector_type  = Utils::Type::GetType(test_case.m_type, 1, 4);
	Utils::ShaderInterface si			= program_interface.GetShaderInterface(Utils::Shader::VERTEX);

	/* Zero means no array, however we still need at least 1 slot of data */
	if (0 == array_length)
	{
		array_length += 1;
	}

	/* Generate data */
	const std::vector<GLubyte>& data	  = vector_type.GenerateDataPacked();
	const size_t				data_size = data.size();

	/* Prepare data for variables */
	m_data.resize(array_length * data_size);

	GLubyte*	   dst = &m_data[0];
	const GLubyte* src = &data[0];

	for (GLuint i = 0; i < array_length; ++i)
	{
		memcpy(dst + data_size * i, src, data_size);
	}

	/* Prepare interface for each stage */
	prepareShaderStage(Utils::Shader::FRAGMENT, vector_type, program_interface, test_case, varying_passthrough);
	prepareShaderStage(Utils::Shader::GEOMETRY, vector_type, program_interface, test_case, varying_passthrough);
	prepareShaderStage(Utils::Shader::TESS_CTRL, vector_type, program_interface, test_case, varying_passthrough);
	prepareShaderStage(Utils::Shader::TESS_EVAL, vector_type, program_interface, test_case, varying_passthrough);
	prepareShaderStage(Utils::Shader::VERTEX, vector_type, program_interface, test_case, varying_passthrough);
}